

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgunzip.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ulong in_RAX;
  FILE *__stream;
  FILE *__s;
  ulong uVar2;
  void *__ptr;
  size_t sVar3;
  void *dest;
  int iVar4;
  char *pcVar5;
  char *fmt;
  uint sourceLen;
  uint outlen;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puts("tgunzip 1.2.1 - example from the tiny inflate library (www.ibsensoftware.com)\n");
  if (argc != 3) {
    main_cold_1();
    return 1;
  }
  tinf_init();
  __stream = fopen(argv[1],"rb");
  if (__stream == (FILE *)0x0) {
    pcVar5 = argv[1];
    fmt = "unable to open input file \'%s\'";
  }
  else {
    __s = fopen(argv[2],"wb");
    if (__s != (FILE *)0x0) {
      fseek(__stream,0,2);
      uVar2 = ftell(__stream);
      fseek(__stream,0,0);
      sourceLen = (uint)uVar2;
      if (sourceLen < 0x12) {
        pcVar5 = "input too small to be gzip";
      }
      else {
        uVar2 = uVar2 & 0xffffffff;
        __ptr = malloc(uVar2);
        if (__ptr != (void *)0x0) {
          sVar3 = fread(__ptr,1,uVar2,__stream);
          if (sVar3 == uVar2) {
            iVar4 = *(int *)((long)__ptr + (ulong)(sourceLen - 4));
            dest = malloc((ulong)(iVar4 + (uint)(iVar4 == 0)));
            if (dest == (void *)0x0) {
              pcVar5 = "not enough memory";
              goto LAB_00101489;
            }
            uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
            iVar1 = tinf_gzip_uncompress(dest,(uint *)((long)&uStack_38 + 4),__ptr,sourceLen);
            if ((iVar1 == 0) && (uStack_38._4_4_ == iVar4)) {
              iVar4 = 0;
              printf("decompressed %u bytes\n");
              fwrite(dest,1,uStack_38 >> 0x20,__s);
              goto LAB_00101498;
            }
            pcVar5 = "decompression failed";
          }
          else {
            pcVar5 = "error reading input file";
LAB_00101489:
            dest = (void *)0x0;
          }
          printf_error(pcVar5);
          iVar4 = 1;
          goto LAB_00101498;
        }
        pcVar5 = "not enough memory";
      }
      __ptr = (void *)0x0;
      printf_error(pcVar5);
      iVar4 = 1;
      dest = (void *)0x0;
      goto LAB_00101498;
    }
    pcVar5 = argv[2];
    fmt = "unable to create output file \'%s\'";
  }
  __ptr = (void *)0x0;
  printf_error(fmt,pcVar5);
  iVar4 = 1;
  dest = (void *)0x0;
  __s = (FILE *)0x0;
LAB_00101498:
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  if (__s != (FILE *)0x0) {
    fclose(__s);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (dest != (void *)0x0) {
    free(dest);
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
	FILE *fin = NULL;
	FILE *fout = NULL;
	unsigned char *source = NULL;
	unsigned char *dest = NULL;
	unsigned int len, dlen, outlen;
	int retval = EXIT_FAILURE;
	int res;

	printf("tgunzip " TINF_VER_STRING " - example from the tiny inflate library (www.ibsensoftware.com)\n\n");

	if (argc != 3) {
		fputs("usage: tgunzip INFILE OUTFILE\n\n"
		      "Both input and output are kept in memory, so do not use this on huge files.\n", stderr);
		return EXIT_FAILURE;
	}

	tinf_init();

	/* -- Open files -- */

	if ((fin = fopen(argv[1], "rb")) == NULL) {
		printf_error("unable to open input file '%s'", argv[1]);
		goto out;
	}

	if ((fout = fopen(argv[2], "wb")) == NULL) {
		printf_error("unable to create output file '%s'", argv[2]);
		goto out;
	}

	/* -- Read source -- */

	fseek(fin, 0, SEEK_END);

	len = ftell(fin);

	fseek(fin, 0, SEEK_SET);

	if (len < 18) {
		printf_error("input too small to be gzip");
		goto out;
	}

	source = (unsigned char *) malloc(len);

	if (source == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	if (fread(source, 1, len, fin) != len) {
		printf_error("error reading input file");
		goto out;
	}

	/* -- Get decompressed length -- */

	dlen = read_le32(&source[len - 4]);

	dest = (unsigned char *) malloc(dlen ? dlen : 1);

	if (dest == NULL) {
		printf_error("not enough memory");
		goto out;
	}

	/* -- Decompress data -- */

	outlen = dlen;

	res = tinf_gzip_uncompress(dest, &outlen, source, len);

	if ((res != TINF_OK) || (outlen != dlen)) {
		printf_error("decompression failed");
		goto out;
	}

	printf("decompressed %u bytes\n", outlen);

	/* -- Write output -- */

	fwrite(dest, 1, outlen, fout);

	retval = EXIT_SUCCESS;

out:
	if (fin != NULL) {
		fclose(fin);
	}

	if (fout != NULL) {
		fclose(fout);
	}

	if (source != NULL) {
		free(source);
	}

	if (dest != NULL) {
		free(dest);
	}

	return retval;
}